

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O2

int cmSystemTools::strverscmp(char *__s1,char *__s2)

{
  char cVar1;
  char cVar2;
  char *s;
  char *s_00;
  long lVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  
  s = *(char **)__s1;
  s_00 = *(char **)__s2;
  sVar6 = 0xffffffffffffffff;
  do {
    cVar1 = s[sVar6 + 1];
    cVar2 = s_00[sVar6 + 1];
    sVar6 = sVar6 + 1;
    if (cVar1 == '\0') break;
  } while (cVar1 == cVar2);
  if (cVar1 != cVar2) {
    lVar3 = 0;
    sVar5 = sVar6;
    while ((sVar5 != 0 && ((int)s[sVar5 - 1] - 0x30U < 10))) {
      lVar3 = lVar3 + 1;
      sVar5 = sVar5 - 1;
    }
    if ((lVar3 != 0) || (((int)cVar1 - 0x30U < 10 && ((int)cVar2 - 0x30U < 10)))) {
      sVar4 = cm_strverscmp_count_leading_zeros(s,sVar5);
      sVar5 = cm_strverscmp_count_leading_zeros(s_00,sVar5);
      if (sVar4 != sVar5) {
        return (sVar4 < sVar5) - 1 | 1;
      }
      if (sVar4 == 0) {
        sVar5 = cm_strverscmp_find_digits_end(s,sVar6);
        sVar6 = cm_strverscmp_find_digits_end(s_00,sVar6);
        if (sVar5 != sVar6) {
          return (uint)(sVar6 < sVar5) * 2 + -1;
        }
      }
    }
  }
  return (int)cVar1 - (int)cVar2;
}

Assistant:

void cmSystemTools::ExpandRegistryValues(std::string& source,
                                         KeyWOW64 /*unused*/)
{
  cmsys::RegularExpression regEntry("\\[(HKEY[^]]*)\\]");
  while (regEntry.find(source)) {
    // the arguments are the second match
    std::string key = regEntry.match(1);
    std::string reg = "[";
    reg += key + "]";
    cmSystemTools::ReplaceString(source, reg.c_str(), "/registry");
  }
}